

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_param_tests1.cpp
# Opt level: O2

void __thiscall
type_param_test::iutest_typed_test_suite_p_name_RegisterVerboseSpaceTypeParamTest_::A<int>::Body
          (A<int> *this)

{
  TestInfo *pTVar1;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  iutest::UnitTest::instance();
  pTVar1 = iutest::Test::GetCurrentTestInfo();
  iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
            (&iutest_ar,(internal *)0x314eeb,
             "::iutest::UnitTest::GetInstance()->current_test_info()->name()","A",
             (pTVar1->m_testname)._M_dataplus._M_p,
             (char *)&iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/type_param_tests1.cpp"
               ,0x42,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_TYPED_TEST_P(VerifyFailTypeParamTest, A)
{
}